

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall CWire::ClearSegmentList(CWire *this)

{
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  int iVar4;
  pointer __pos;
  uint uVar5;
  ulong uVar6;
  int iIndex;
  
  __pos = (this->m_SegmentList).
          super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(this->m_SegmentList).
                              super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)__pos) >> 3) *
          -0x55555555;
  if (0 < iVar4) {
    iIndex = 0;
    do {
      pvVar1 = GetSegmentList(this,iIndex);
      ppCVar2 = (pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = (pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar5 = (uint)((ulong)((long)ppCVar3 - (long)ppCVar2) >> 3);
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          CSegment::Delete((pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar6]);
          uVar6 = uVar6 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar6);
        ppCVar2 = (pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar3 = (pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      if (ppCVar3 != ppCVar2) {
        (pvVar1->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = ppCVar2;
      }
      iIndex = iIndex + 1;
    } while (iIndex != iVar4);
    __pos = (this->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
  ::_M_erase_at_end(&this->m_SegmentList,__pos);
  this->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  return;
}

Assistant:

void CWire::ClearSegmentList()
{
	int	iNumSegmentList	=	GetNumSegmentList();

	for (int i=0;i<iNumSegmentList;++i)
	{
		vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
		for (int j=0,s=pSegmentList->size();j<s;++j)
		{
			(*pSegmentList)[j]->Delete();//SAFE_DEL((*pSegmentList)[j]);
		}

		pSegmentList->clear();
	}

	m_SegmentList.clear();
	m_pRoutedSegmentList	=	NULL;
}